

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::_::ArrayDisposableOwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>::
disposeImpl(ArrayDisposableOwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
            *this,void *param_1,size_t param_2,size_t param_3,size_t param_4,
           _func_void_void_ptr *param_5)

{
  if ((this->super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>).first
      .ptr != (DestructionOrderRecorder *)0x0) {
    (this->super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>).first.
    ptr = (DestructionOrderRecorder *)0x0;
    (**((this->super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>).
        first.disposer)->_vptr_Disposer)();
  }
  operator_delete(this,0x18);
  return;
}

Assistant:

void disposeImpl(void*, size_t, size_t, size_t, void (*)(void*)) const override { delete this; }